

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_2_3_False(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  int iVar2;
  float *pfVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  int scale;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  float *data;
  ulong uVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  int iVar37;
  float *pfVar38;
  long lVar39;
  long lVar40;
  ulong uVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  float *pfVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  int k_count;
  int iVar50;
  long lVar51;
  int iVar52;
  float *pfVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [64];
  float fVar67;
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar83;
  undefined1 auVar84 [16];
  float fVar85;
  undefined1 auVar86 [12];
  undefined1 in_ZMM8 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  undefined1 auVar90 [64];
  int data_width;
  float *local_f0;
  int local_e8;
  
  auVar62._8_4_ = 0x3effffff;
  auVar62._0_8_ = 0x3effffff3effffff;
  auVar62._12_4_ = 0x3effffff;
  auVar61._8_4_ = 0x80000000;
  auVar61._0_8_ = 0x8000000080000000;
  auVar61._12_4_ = 0x80000000;
  fVar68 = ipoint->scale;
  auVar90 = ZEXT464((uint)fVar68);
  auVar54 = vpternlogd_avx512vl(auVar62,ZEXT416((uint)fVar68),auVar61,0xf8);
  auVar54 = ZEXT416((uint)(fVar68 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  fVar67 = -0.08 / (fVar68 * fVar68);
  scale = (int)auVar54._0_4_;
  auVar55._0_4_ = (int)auVar54._0_4_;
  auVar55._4_4_ = (int)auVar54._4_4_;
  auVar55._8_4_ = (int)auVar54._8_4_;
  auVar55._12_4_ = (int)auVar54._12_4_;
  auVar54 = vcvtdq2ps_avx(auVar55);
  auVar55 = vpternlogd_avx512vl(auVar62,ZEXT416((uint)ipoint->x),auVar61,0xf8);
  auVar55 = ZEXT416((uint)(ipoint->x + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56._0_8_ = (double)auVar55._0_4_;
  auVar56._8_8_ = auVar55._8_8_;
  auVar60._0_8_ = (double)fVar68;
  auVar60._8_8_ = 0;
  auVar55 = vfmadd231sd_fma(auVar56,auVar60,ZEXT816(0x3fe0000000000000));
  auVar59._0_4_ = (float)auVar55._0_8_;
  auVar59._4_12_ = auVar55._4_12_;
  auVar55 = vpternlogd_avx512vl(auVar62,ZEXT416((uint)ipoint->y),auVar61,0xf8);
  fVar5 = auVar59._0_4_ - auVar54._0_4_;
  auVar55 = ZEXT416((uint)(ipoint->y + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar57._0_8_ = (double)auVar55._0_4_;
  auVar57._8_8_ = auVar55._8_8_;
  auVar55 = vfmadd231sd_fma(auVar57,auVar60,ZEXT816(0x3fe0000000000000));
  auVar58._0_4_ = (float)auVar55._0_8_;
  auVar58._4_12_ = auVar55._4_12_;
  fVar89 = auVar58._0_4_ - auVar54._0_4_;
  auVar54 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar68),auVar59);
  auVar55 = vpternlogd_avx512vl(auVar62,auVar54,auVar61,0xf8);
  auVar54 = ZEXT416((uint)(auVar54._0_4_ + auVar55._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = ZEXT416((uint)fVar68);
  if (scale < (int)auVar54._0_4_) {
    auVar63._8_4_ = 0x3effffff;
    auVar63._0_8_ = 0x3effffff3effffff;
    auVar63._12_4_ = 0x3effffff;
    auVar64._8_4_ = 0x80000000;
    auVar64._0_8_ = 0x8000000080000000;
    auVar64._12_4_ = 0x80000000;
    auVar54 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar55,auVar58);
    auVar56 = vpternlogd_avx512vl(auVar64,auVar54,auVar63,0xea);
    auVar54 = ZEXT416((uint)(auVar54._0_4_ + auVar56._0_4_));
    auVar54 = vroundss_avx(auVar54,auVar54,0xb);
    if (scale < (int)auVar54._0_4_) {
      auVar54 = vfmadd231ss_fma(auVar59,auVar55,ZEXT416(0x41300000));
      auVar65._8_4_ = 0x80000000;
      auVar65._0_8_ = 0x8000000080000000;
      auVar65._12_4_ = 0x80000000;
      auVar56 = vpternlogd_avx512vl(auVar65,auVar54,auVar63,0xea);
      auVar54 = ZEXT416((uint)(auVar54._0_4_ + auVar56._0_4_));
      auVar54 = vroundss_avx(auVar54,auVar54,0xb);
      if ((int)auVar54._0_4_ + scale <= iimage->width) {
        auVar54 = vfmadd231ss_fma(auVar58,auVar55,ZEXT416(0x41300000));
        auVar15._8_4_ = 0x80000000;
        auVar15._0_8_ = 0x8000000080000000;
        auVar15._12_4_ = 0x80000000;
        auVar56 = vpternlogd_avx512vl(auVar63,auVar54,auVar15,0xf8);
        auVar54 = ZEXT416((uint)(auVar54._0_4_ + auVar56._0_4_));
        auVar54 = vroundss_avx(auVar54,auVar54,0xb);
        if ((int)auVar54._0_4_ + scale <= iimage->height) {
          iVar2 = iimage->data_width;
          pfVar38 = iimage->data;
          fVar5 = fVar5 + 0.5;
          local_f0 = haarResponseY + 0x1a;
          pfVar53 = haarResponseX + 0x1a;
          iVar50 = scale * 2;
          uVar19 = 0xfffffff4;
          do {
            auVar54._0_4_ = (float)(int)uVar19;
            auVar54._4_12_ = in_ZMM8._4_12_;
            lVar48 = 0;
            auVar82._0_4_ = (float)(int)(uVar19 | 1);
            auVar82._4_12_ = in_ZMM8._4_12_;
            auVar54 = vfmadd213ss_fma(auVar54,auVar55,ZEXT416((uint)(fVar89 + 0.5)));
            auVar56 = vfmadd213ss_fma(auVar82,auVar55,ZEXT416((uint)(fVar89 + 0.5)));
            iVar17 = (int)auVar54._0_4_;
            iVar22 = (int)auVar56._0_4_;
            iVar18 = (iVar17 + -1) * iVar2;
            iVar23 = (iVar17 + -1 + scale) * iVar2;
            iVar25 = (iVar17 + -1 + iVar50) * iVar2;
            iVar17 = (iVar22 + -1) * iVar2;
            iVar24 = (iVar22 + -1 + scale) * iVar2;
            iVar22 = (iVar22 + -1 + iVar50) * iVar2;
            do {
              iVar26 = (int)lVar48;
              auVar78._0_4_ = (float)(iVar26 + -0xc);
              auVar86 = auVar62._4_12_;
              auVar78._4_12_ = auVar86;
              auVar54 = vfmadd213ss_fma(auVar78,auVar55,ZEXT416((uint)fVar5));
              iVar42 = (int)auVar54._0_4_;
              auVar79._0_4_ = (float)(iVar26 + -0xb);
              auVar79._4_12_ = auVar86;
              auVar54 = vfmadd213ss_fma(auVar79,auVar55,ZEXT416((uint)fVar5));
              iVar32 = iVar42 + -1 + iVar50;
              iVar35 = (int)auVar54._0_4_;
              auVar80._0_4_ = (float)(iVar26 + -10);
              auVar80._4_12_ = auVar86;
              auVar54 = vfmadd213ss_fma(auVar80,auVar55,ZEXT416((uint)fVar5));
              iVar34 = iVar35 + -1 + iVar50;
              iVar27 = (int)auVar54._0_4_;
              iVar28 = iVar42 + -1 + scale;
              fVar68 = pfVar38[iVar25 + -1 + iVar42];
              fVar71 = pfVar38[iVar18 + iVar32];
              iVar37 = iVar35 + -1 + scale;
              auVar57 = SUB6416(ZEXT464(0x40000000),0);
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar18 + iVar28] -
                                                      pfVar38[iVar25 + iVar28])),auVar57,
                                        ZEXT416((uint)(pfVar38[iVar25 + iVar32] -
                                                      pfVar38[iVar18 + -1 + iVar42])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar23 + -1 + iVar42] -
                                                      pfVar38[iVar23 + iVar32])),auVar57,
                                        ZEXT416((uint)(pfVar38[iVar25 + iVar32] -
                                                      pfVar38[iVar18 + -1 + iVar42])));
              pfVar53[lVar48 + -0x1a] = (fVar68 - fVar71) + auVar54._0_4_;
              local_f0[lVar48 + -0x1a] = auVar56._0_4_ - (fVar68 - fVar71);
              fVar68 = pfVar38[iVar25 + -1 + iVar35];
              fVar71 = pfVar38[iVar18 + iVar34];
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar18 + iVar37] -
                                                      pfVar38[iVar25 + iVar37])),auVar57,
                                        ZEXT416((uint)(pfVar38[iVar25 + iVar34] -
                                                      pfVar38[iVar18 + -1 + iVar35])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar23 + -1 + iVar35] -
                                                      pfVar38[iVar23 + iVar34])),auVar57,
                                        ZEXT416((uint)(pfVar38[iVar25 + iVar34] -
                                                      pfVar38[iVar18 + -1 + iVar35])));
              pfVar53[lVar48 + -0x19] = (fVar68 - fVar71) + auVar54._0_4_;
              local_f0[lVar48 + -0x19] = auVar56._0_4_ - (fVar68 - fVar71);
              iVar52 = iVar27 + -1 + scale;
              iVar45 = iVar27 + -1 + iVar50;
              fVar68 = pfVar38[iVar25 + -1 + iVar27];
              fVar71 = pfVar38[iVar18 + iVar45];
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar18 + iVar52] -
                                                      pfVar38[iVar25 + iVar52])),auVar57,
                                        ZEXT416((uint)(pfVar38[iVar25 + iVar45] -
                                                      pfVar38[iVar18 + -1 + iVar27])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar23 + -1 + iVar27] -
                                                      pfVar38[iVar23 + iVar45])),auVar57,
                                        ZEXT416((uint)(pfVar38[iVar25 + iVar45] -
                                                      pfVar38[iVar18 + -1 + iVar27])));
              pfVar53[lVar48 + -0x18] = (fVar68 - fVar71) + auVar54._0_4_;
              local_f0[lVar48 + -0x18] = auVar56._0_4_ - (fVar68 - fVar71);
              fVar68 = pfVar38[iVar22 + -1 + iVar42];
              fVar71 = pfVar38[iVar17 + iVar32];
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar17 + iVar28] -
                                                      pfVar38[iVar28 + iVar22])),auVar57,
                                        ZEXT416((uint)(pfVar38[iVar32 + iVar22] -
                                                      pfVar38[iVar17 + -1 + iVar42])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar24 + -1 + iVar42] -
                                                      pfVar38[iVar24 + iVar32])),auVar57,
                                        ZEXT416((uint)(pfVar38[iVar32 + iVar22] -
                                                      pfVar38[iVar17 + -1 + iVar42])));
              pfVar53[lVar48 + -2] = (fVar68 - fVar71) + auVar54._0_4_;
              local_f0[lVar48 + -2] = auVar56._0_4_ - (fVar68 - fVar71);
              fVar68 = pfVar38[iVar22 + -1 + iVar35];
              fVar71 = pfVar38[iVar17 + iVar34];
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar24 + -1 + iVar35] -
                                                      pfVar38[iVar24 + iVar34])),auVar57,
                                        ZEXT416((uint)(pfVar38[iVar34 + iVar22] -
                                                      pfVar38[iVar17 + -1 + iVar35])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar17 + iVar37] -
                                                      pfVar38[iVar37 + iVar22])),auVar57,
                                        ZEXT416((uint)(pfVar38[iVar34 + iVar22] -
                                                      pfVar38[iVar17 + -1 + iVar35])));
              pfVar53[lVar48 + -1] = (fVar68 - fVar71) + auVar56._0_4_;
              local_f0[lVar48 + -1] = auVar54._0_4_ - (fVar68 - fVar71);
              fVar68 = pfVar38[iVar22 + -1 + iVar27];
              fVar71 = pfVar38[iVar17 + iVar45];
              auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar17 + iVar52] -
                                                      pfVar38[iVar52 + iVar22])),auVar57,
                                        ZEXT416((uint)(pfVar38[iVar45 + iVar22] -
                                                      pfVar38[iVar17 + -1 + iVar27])));
              auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar38[iVar24 + -1 + iVar27] -
                                                      pfVar38[iVar24 + iVar45])),auVar57,
                                        ZEXT416((uint)(pfVar38[iVar45 + iVar22] -
                                                      pfVar38[iVar17 + -1 + iVar27])));
              pfVar53[lVar48] = (fVar68 - fVar71) + auVar54._0_4_;
              local_f0[lVar48] = auVar56._0_4_ - (fVar68 - fVar71);
              lVar48 = lVar48 + 3;
            } while (iVar26 + -0xc < 9);
            local_f0 = local_f0 + 0x30;
            pfVar53 = pfVar53 + 0x30;
            bVar4 = (int)uVar19 < 10;
            uVar19 = uVar19 + 2;
          } while (bVar4);
          goto LAB_001b49e8;
        }
      }
    }
  }
  lVar48 = 0;
  iVar2 = scale * 2;
  uVar19 = 0xfffffff4;
  do {
    auVar69._0_4_ = (float)(int)uVar19;
    auVar69._4_12_ = in_ZMM8._4_12_;
    auVar72._0_4_ = (float)(int)(uVar19 | 1);
    auVar72._4_12_ = in_ZMM8._4_12_;
    auVar54 = vfmadd213ss_fma(auVar69,auVar90._0_16_,ZEXT416((uint)fVar89));
    auVar56 = vfmadd213ss_fma(auVar72,auVar90._0_16_,ZEXT416((uint)fVar89));
    fVar68 = auVar54._0_4_;
    fVar71 = auVar56._0_4_;
    iVar52 = (int)((double)((ulong)(0.0 <= fVar68) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar68) * -0x4020000000000000) + (double)fVar68);
    iVar22 = iVar2 + iVar52;
    iVar23 = iVar52 + -1;
    iVar24 = iVar52 + -1 + scale;
    iVar18 = (int)((double)((ulong)(0.0 <= fVar71) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar71) * -0x4020000000000000) + (double)fVar71);
    iVar25 = iVar2 + -1 + iVar52;
    iVar26 = iVar2 + iVar18;
    iVar17 = iVar2 + -1 + iVar18;
    iVar27 = iVar18 + -1;
    iVar28 = iVar18 + -1 + scale;
    pfVar38 = haarResponseX;
    pfVar53 = haarResponseY;
    lVar47 = lVar48;
    iVar50 = -0xc;
    do {
      auVar70._0_4_ = (float)iVar50;
      auVar86 = in_ZMM8._4_12_;
      auVar70._4_12_ = auVar86;
      auVar84._0_4_ = (float)(iVar50 + 1);
      auVar84._4_12_ = auVar86;
      auVar57 = auVar90._0_16_;
      auVar54 = vfmadd213ss_fma(auVar70,auVar57,ZEXT416((uint)fVar5));
      auVar56 = vfmadd213ss_fma(auVar84,auVar57,ZEXT416((uint)fVar5));
      fVar83 = auVar56._0_4_;
      auVar75._0_4_ = (float)(iVar50 + 2);
      auVar75._4_12_ = auVar86;
      auVar56 = vfmadd213ss_fma(auVar75,auVar57,ZEXT416((uint)fVar5));
      fVar68 = auVar54._0_4_;
      fVar71 = auVar56._0_4_;
      iVar42 = (int)((double)((ulong)(0.0 <= fVar68) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar68) * -0x4020000000000000) + (double)fVar68);
      if (((iVar52 < 1) || (iVar42 < 1)) || (iimage->height < iVar22)) {
LAB_001b425e:
        haarXY(iimage,iVar52,iVar42,scale,(float *)((long)pfVar38 + lVar47),
               (float *)((long)pfVar53 + lVar47));
        iVar37 = iimage->width;
        pfVar38 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar37 = iimage->width;
        iVar32 = iVar2 + iVar42;
        if (iVar37 < iVar32) goto LAB_001b425e;
        iVar34 = iimage->data_width;
        pfVar46 = iimage->data;
        iVar45 = iVar34 * iVar23;
        iVar35 = iVar42 + -1 + scale;
        iVar29 = iVar34 * iVar25;
        fVar68 = pfVar46[iVar29 + -1 + iVar42];
        fVar6 = pfVar46[iVar45 + -1 + iVar32];
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar46[iVar45 + iVar35] - pfVar46[iVar29 + iVar35]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar46[iVar29 + -1 + iVar32] -
                                                pfVar46[iVar45 + -1 + iVar42])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar46[iVar34 * iVar24 + -1 + iVar42] -
                                                pfVar46[iVar34 * iVar24 + -1 + iVar32])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar46[iVar29 + -1 + iVar32] -
                                                pfVar46[iVar45 + -1 + iVar42])));
        *(float *)((long)pfVar38 + lVar47) = (fVar68 - fVar6) + auVar54._0_4_;
        *(float *)((long)pfVar53 + lVar47) = auVar56._0_4_ - (fVar68 - fVar6);
      }
      pfVar46 = (float *)((long)pfVar38 + lVar47 + 4);
      pfVar1 = (float *)((long)pfVar53 + lVar47 + 4);
      iVar32 = (int)((double)((ulong)(0.0 <= fVar83) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar83) * -0x4020000000000000) + (double)fVar83);
      if (((iVar52 < 1) || (iVar32 < 1)) ||
         ((iimage->height < iVar22 || (iVar34 = iVar2 + iVar32, iVar37 < iVar34)))) {
        haarXY(iimage,iVar52,iVar32,scale,pfVar46,pfVar1);
        iVar37 = iimage->width;
        pfVar38 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar35 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar29 = iVar35 * iVar23;
        iVar45 = iVar32 + -1 + scale;
        iVar44 = iVar35 * iVar25;
        fVar68 = pfVar3[iVar44 + -1 + iVar32];
        fVar83 = pfVar3[iVar29 + -1 + iVar34];
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar29 + iVar45] - pfVar3[iVar44 + iVar45]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar34] -
                                                pfVar3[iVar29 + -1 + iVar32])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar35 * iVar24 + -1 + iVar32] -
                                                pfVar3[iVar35 * iVar24 + -1 + iVar34])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar34] -
                                                pfVar3[iVar29 + -1 + iVar32])));
        *pfVar46 = (fVar68 - fVar83) + auVar54._0_4_;
        *pfVar1 = auVar56._0_4_ - (fVar68 - fVar83);
      }
      pfVar46 = (float *)((long)pfVar38 + lVar47 + 8);
      pfVar1 = (float *)((long)pfVar53 + lVar47 + 8);
      iVar34 = (int)((double)((ulong)(0.0 <= fVar71) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar71) * -0x4020000000000000) + (double)fVar71);
      if (((iVar52 < 1) || (iVar34 < 1)) ||
         ((iimage->height < iVar22 || (iVar35 = iVar2 + iVar34, iVar37 < iVar35)))) {
        haarXY(iimage,iVar52,iVar34,scale,pfVar46,pfVar1);
        iVar37 = iimage->width;
        pfVar38 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar45 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar44 = iVar34 + -1 + scale;
        iVar29 = iVar45 * iVar23;
        iVar43 = iVar45 * iVar25;
        fVar68 = pfVar3[iVar43 + -1 + iVar34];
        fVar71 = pfVar3[iVar29 + -1 + iVar35];
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar45 * iVar24 + -1 + iVar34] -
                                                pfVar3[iVar45 * iVar24 + -1 + iVar35])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar35] -
                                                pfVar3[iVar29 + -1 + iVar34])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar29 + iVar44] - pfVar3[iVar43 + iVar44]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar35] -
                                                pfVar3[iVar29 + -1 + iVar34])));
        *pfVar46 = (fVar68 - fVar71) + auVar56._0_4_;
        *pfVar1 = auVar54._0_4_ - (fVar68 - fVar71);
      }
      pfVar46 = (float *)((long)pfVar38 + lVar47 + 0x60);
      pfVar1 = (float *)((long)pfVar53 + lVar47 + 0x60);
      if ((((iVar18 < 1) || (iVar42 < 1)) || (iimage->height < iVar26)) ||
         (iVar35 = iVar2 + iVar42, iVar37 < iVar35)) {
        haarXY(iimage,iVar18,iVar42,scale,pfVar46,pfVar1);
        iVar37 = iimage->width;
        pfVar38 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        pfVar3 = iimage->data;
        iVar44 = iVar42 + -1 + scale;
        iVar45 = iimage->data_width;
        iVar29 = iVar45 * iVar27;
        iVar43 = iVar45 * iVar17;
        fVar68 = pfVar3[iVar43 + -1 + iVar42];
        fVar71 = pfVar3[iVar29 + -1 + iVar35];
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar29 + iVar44] - pfVar3[iVar43 + iVar44]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar35] -
                                                pfVar3[iVar29 + -1 + iVar42])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar45 * iVar28 + -1 + iVar42] -
                                                pfVar3[iVar45 * iVar28 + -1 + iVar35])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar35] -
                                                pfVar3[iVar29 + -1 + iVar42])));
        *pfVar46 = (fVar68 - fVar71) + auVar54._0_4_;
        *pfVar1 = auVar56._0_4_ - (fVar68 - fVar71);
      }
      pfVar46 = (float *)((long)pfVar38 + lVar47 + 100);
      pfVar1 = (float *)((long)pfVar53 + lVar47 + 100);
      if (((iVar18 < 1) || (iVar32 < 1)) ||
         ((iimage->height < iVar26 || (iVar42 = iVar2 + iVar32, iVar37 < iVar42)))) {
        haarXY(iimage,iVar18,iVar32,scale,pfVar46,pfVar1);
        iVar37 = iimage->width;
        pfVar38 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar35 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar45 = iVar32 + -1 + scale;
        iVar29 = iVar35 * iVar27;
        iVar44 = iVar35 * iVar17;
        fVar68 = pfVar3[iVar44 + -1 + iVar32];
        fVar71 = pfVar3[iVar29 + -1 + iVar42];
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar29 + iVar45] - pfVar3[iVar44 + iVar45]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar42] -
                                                pfVar3[iVar29 + -1 + iVar32])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar35 * iVar28 + -1 + iVar32] -
                                                pfVar3[iVar35 * iVar28 + -1 + iVar42])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar44 + -1 + iVar42] -
                                                pfVar3[iVar29 + -1 + iVar32])));
        *pfVar46 = (fVar68 - fVar71) + auVar54._0_4_;
        *pfVar1 = auVar56._0_4_ - (fVar68 - fVar71);
      }
      pfVar46 = (float *)((long)pfVar38 + lVar47 + 0x68);
      pfVar1 = (float *)((long)pfVar53 + lVar47 + 0x68);
      if (((iVar18 < 1) || (iVar34 < 1)) ||
         ((iimage->height < iVar26 || (iVar42 = iVar2 + iVar34, iVar37 < iVar42)))) {
        haarXY(iimage,iVar18,iVar34,scale,pfVar46,pfVar1);
        pfVar38 = haarResponseX;
        pfVar53 = haarResponseY;
      }
      else {
        iVar37 = iimage->data_width;
        iVar45 = iVar37 * iVar27;
        iVar32 = iVar34 + -1 + scale;
        pfVar3 = iimage->data;
        iVar35 = iVar37 * iVar17;
        fVar68 = pfVar3[iVar35 + -1 + iVar34];
        fVar71 = pfVar3[iVar45 + -1 + iVar42];
        auVar54 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar45 + iVar32] - pfVar3[iVar35 + iVar32]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar35 + -1 + iVar42] -
                                                pfVar3[iVar45 + -1 + iVar34])));
        auVar56 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar37 * iVar28 + -1 + iVar34] -
                                                pfVar3[iVar37 * iVar28 + -1 + iVar42])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar35 + -1 + iVar42] -
                                                pfVar3[iVar45 + -1 + iVar34])));
        *pfVar46 = (fVar68 - fVar71) + auVar54._0_4_;
        *pfVar1 = auVar56._0_4_ - (fVar68 - fVar71);
      }
      auVar90 = ZEXT1664(auVar55);
      lVar47 = lVar47 + 0xc;
      bVar4 = iVar50 < 9;
      iVar50 = iVar50 + 3;
    } while (bVar4);
    lVar48 = lVar48 + 0xc0;
    bVar4 = (int)uVar19 < 10;
    uVar19 = uVar19 + 2;
  } while (bVar4);
LAB_001b49e8:
  fVar89 = auVar90._0_4_;
  auVar88._8_4_ = 0x3effffff;
  auVar88._0_8_ = 0x3effffff3effffff;
  auVar88._12_4_ = 0x3effffff;
  auVar87._8_4_ = 0x80000000;
  auVar87._0_8_ = 0x8000000080000000;
  auVar87._12_4_ = 0x80000000;
  auVar54 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 0.5)),auVar87,0xf8);
  auVar54 = ZEXT416((uint)(fVar89 * 0.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 1.5)),auVar87,0xf8);
  auVar55 = ZEXT416((uint)(fVar89 * 1.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 2.5)),auVar87,0xf8);
  auVar56 = ZEXT416((uint)(fVar89 * 2.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 3.5)),auVar87,0xf8);
  auVar57 = ZEXT416((uint)(fVar89 * 3.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 4.5)),auVar87,0xf8);
  auVar58 = ZEXT416((uint)(fVar89 * 4.5 + auVar58._0_4_));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar59 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 5.5)),auVar87,0xf8);
  auVar59 = ZEXT416((uint)(fVar89 * 5.5 + auVar59._0_4_));
  auVar59 = vroundss_avx(auVar59,auVar59,0xb);
  auVar60 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 6.5)),auVar87,0xf8);
  auVar60 = ZEXT416((uint)(fVar89 * 6.5 + auVar60._0_4_));
  auVar60 = vroundss_avx(auVar60,auVar60,0xb);
  auVar61 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 7.5)),auVar87,0xf8);
  auVar61 = ZEXT416((uint)(auVar61._0_4_ + fVar89 * 7.5));
  auVar61 = vroundss_avx(auVar61,auVar61,0xb);
  auVar62 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 8.5)),auVar87,0xf8);
  auVar62 = ZEXT416((uint)(fVar89 * 8.5 + auVar62._0_4_));
  auVar62 = vroundss_avx(auVar62,auVar62,0xb);
  auVar63 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 9.5)),auVar87,0xf8);
  auVar63 = ZEXT416((uint)(fVar89 * 9.5 + auVar63._0_4_));
  auVar63 = vroundss_avx(auVar63,auVar63,0xb);
  auVar64 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 10.5)),auVar87,0xf8);
  auVar64 = ZEXT416((uint)(fVar89 * 10.5 + auVar64._0_4_));
  auVar64 = vroundss_avx(auVar64,auVar64,0xb);
  auVar65 = vpternlogd_avx512vl(auVar88,ZEXT416((uint)(fVar89 * 11.5)),auVar87,0xf8);
  fVar74 = auVar56._0_4_;
  fVar68 = fVar74 + auVar55._0_4_;
  fVar5 = fVar74 + auVar54._0_4_;
  auVar56 = ZEXT416((uint)(fVar89 * 11.5 + auVar65._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  fVar89 = fVar74 - auVar54._0_4_;
  fVar71 = fVar74 - auVar55._0_4_;
  fVar83 = fVar74 - auVar57._0_4_;
  fVar6 = fVar74 - auVar58._0_4_;
  fVar7 = fVar74 - auVar59._0_4_;
  fVar74 = fVar74 - auVar60._0_4_;
  fVar85 = auVar61._0_4_;
  fVar8 = fVar85 - auVar57._0_4_;
  fVar9 = fVar85 - auVar58._0_4_;
  fVar10 = fVar85 - auVar59._0_4_;
  fVar11 = fVar85 - auVar60._0_4_;
  fVar12 = fVar85 - auVar62._0_4_;
  fVar13 = fVar85 - auVar63._0_4_;
  fVar14 = fVar85 - auVar64._0_4_;
  fVar85 = fVar85 - auVar56._0_4_;
  gauss_s1_c0[0] = expf(fVar68 * fVar68 * fVar67);
  gauss_s1_c0[1] = expf(fVar5 * fVar5 * fVar67);
  gauss_s1_c0[2] = expf(fVar89 * fVar89 * fVar67);
  gauss_s1_c0[3] = expf(fVar71 * fVar71 * fVar67);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar83 * fVar83 * fVar67);
  gauss_s1_c0[6] = expf(fVar6 * fVar6 * fVar67);
  gauss_s1_c0[7] = expf(fVar7 * fVar7 * fVar67);
  gauss_s1_c0[8] = expf(fVar74 * fVar74 * fVar67);
  gauss_s1_c1[0] = expf(fVar8 * fVar8 * fVar67);
  gauss_s1_c1[1] = expf(fVar9 * fVar9 * fVar67);
  gauss_s1_c1[2] = expf(fVar10 * fVar10 * fVar67);
  gauss_s1_c1[3] = expf(fVar11 * fVar11 * fVar67);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar12 * fVar12 * fVar67);
  gauss_s1_c1[6] = expf(fVar13 * fVar13 * fVar67);
  gauss_s1_c1[7] = expf(fVar14 * fVar14 * fVar67);
  gauss_s1_c1[8] = expf(fVar85 * fVar85 * fVar67);
  auVar73._8_4_ = 0x7fffffff;
  auVar73._0_8_ = 0x7fffffff7fffffff;
  auVar73._12_4_ = 0x7fffffff;
  uVar20 = 0xfffffff8;
  fVar68 = 0.0;
  lVar48 = 0;
  lVar47 = 0;
  local_e8 = 0;
  do {
    pfVar38 = gauss_s1_c1;
    uVar19 = (uint)uVar20;
    if (uVar19 != 7) {
      pfVar38 = gauss_s1_c0;
    }
    lVar49 = (long)local_e8;
    lVar47 = (long)(int)lVar47;
    if (uVar19 == 0xfffffff8) {
      pfVar38 = gauss_s1_c1;
    }
    uVar41 = 0;
    local_e8 = local_e8 + 4;
    uVar36 = 0xfffffff8;
    lVar39 = (long)haarResponseX + lVar48;
    lVar31 = (long)haarResponseY + lVar48;
    do {
      pfVar53 = gauss_s1_c1;
      if (uVar36 != 7) {
        pfVar53 = gauss_s1_c0;
      }
      auVar90 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar36 == 0xfffffff8) {
        pfVar53 = gauss_s1_c1;
      }
      uVar21 = (ulong)(uVar36 >> 0x1c & 0xfffffff8);
      uVar30 = uVar41;
      lVar33 = lVar31;
      lVar51 = lVar39;
      do {
        lVar40 = 0;
        pfVar46 = (float *)((long)pfVar38 + (ulong)(uint)((int)(uVar20 >> 0x1f) << 5));
        do {
          fVar5 = pfVar53[uVar21] * *pfVar46;
          pfVar46 = pfVar46 + (ulong)(~uVar19 >> 0x1f) * 2 + -1;
          auVar54 = vinsertps_avx(ZEXT416(*(uint *)(lVar33 + lVar40 * 4)),
                                  ZEXT416(*(uint *)(lVar51 + lVar40 * 4)),0x10);
          lVar40 = lVar40 + 1;
          auVar81._0_4_ = fVar5 * auVar54._0_4_;
          auVar81._4_4_ = fVar5 * auVar54._4_4_;
          auVar81._8_4_ = fVar5 * auVar54._8_4_;
          auVar81._12_4_ = fVar5 * auVar54._12_4_;
          auVar54 = vandps_avx(auVar81,auVar73);
          auVar54 = vmovlhps_avx(auVar81,auVar54);
          auVar76._0_4_ = auVar90._0_4_ + auVar54._0_4_;
          auVar76._4_4_ = auVar90._4_4_ + auVar54._4_4_;
          auVar76._8_4_ = auVar90._8_4_ + auVar54._8_4_;
          auVar76._12_4_ = auVar90._12_4_ + auVar54._12_4_;
          auVar90 = ZEXT1664(auVar76);
        } while (lVar40 != 9);
        uVar30 = uVar30 + 0x18;
        uVar21 = uVar21 + (ulong)(-1 < (int)uVar36) * 2 + -1;
        lVar51 = lVar51 + 0x60;
        lVar33 = lVar33 + 0x60;
      } while (uVar30 < uVar36 * 0x18 + 0x198);
      uVar36 = uVar36 + 5;
      uVar41 = uVar41 + 0x78;
      fVar5 = gauss_s2_arr[lVar49];
      auVar16._4_4_ = fVar5;
      auVar16._0_4_ = fVar5;
      auVar16._8_4_ = fVar5;
      auVar16._12_4_ = fVar5;
      auVar57 = vmulps_avx512vl(auVar76,auVar16);
      lVar49 = lVar49 + 1;
      auVar77._0_4_ = auVar57._0_4_ * auVar57._0_4_;
      auVar77._4_4_ = auVar57._4_4_ * auVar57._4_4_;
      auVar77._8_4_ = auVar57._8_4_ * auVar57._8_4_;
      auVar77._12_4_ = auVar57._12_4_ * auVar57._12_4_;
      auVar55 = vshufpd_avx(auVar57,auVar57,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar47) = auVar57;
      lVar47 = lVar47 + 4;
      lVar39 = lVar39 + 0x1e0;
      lVar31 = lVar31 + 0x1e0;
      auVar54 = vmovshdup_avx(auVar77);
      auVar56 = vfmadd231ss_fma(auVar54,auVar57,auVar57);
      auVar54 = vshufps_avx(auVar57,auVar57,0xff);
      auVar55 = vfmadd213ss_fma(auVar55,auVar55,auVar56);
      auVar54 = vfmadd213ss_fma(auVar54,auVar54,auVar55);
      fVar68 = fVar68 + auVar54._0_4_;
    } while (local_e8 != (int)lVar49);
    lVar48 = lVar48 + 0x14;
    uVar20 = (ulong)(uVar19 + 5);
  } while ((int)uVar19 < 3);
  if (fVar68 < 0.0) {
    fVar68 = sqrtf(fVar68);
  }
  else {
    auVar54 = vsqrtss_avx(ZEXT416((uint)fVar68),ZEXT416((uint)fVar68));
    fVar68 = auVar54._0_4_;
  }
  lVar48 = 0;
  auVar90 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar68)));
  do {
    auVar66 = vmulps_avx512f(auVar90,*(undefined1 (*) [64])(ipoint->descriptor + lVar48));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar48) = auVar66;
    lVar48 = lVar48 + 0x10;
  } while (lVar48 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_3_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}